

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

void __thiscall
gvr::PLYReader::getComments
          (PLYReader *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *clist)

{
  value_type *pvVar1;
  const_reference ppPVar2;
  long lVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  size_t i;
  value_type *__x;
  value_type *local_18;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x1457e2);
  local_18 = (value_type *)0x0;
  while( true ) {
    __x = local_18;
    pvVar1 = (value_type *)
             std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::size
                       ((vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_> *)
                        (in_RDI + 0x17));
    if (pvVar1 <= __x) break;
    ppPVar2 = std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::operator[]
                        ((vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_> *)
                         (in_RDI + 0x17),(size_type)local_18);
    lVar3 = PLYElement::getInstances(*ppPVar2);
    if (lVar3 < 0) {
      ppPVar2 = std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::operator[]
                          ((vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_> *)
                           (in_RDI + 0x17),(size_type)local_18);
      PLYElement::getName_abi_cxx11_(*ppPVar2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(in_RDI,__x);
    }
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void PLYReader::getComments(std::vector<std::string> &clist) const
{
  clist.clear();

  for (size_t i=0; i<list.size(); i++)
  {
    if (list[i]->getInstances() < 0)
    {
      clist.push_back(list[i]->getName());
    }
  }
}